

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

void __thiscall gvr::Mesh::recalculateNormals(Mesh *this)

{
  _func_int **pp_Var1;
  ulong uVar2;
  PointCloud *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  int k;
  float len;
  float nz;
  float ny;
  float nx;
  float z1;
  float y1;
  float x1;
  float z0;
  float y0;
  float x0;
  int i_1;
  int i;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  int local_3c;
  int local_10;
  int local_c;
  
  local_c = PointCloud::getVertexCount(in_RDI);
  local_c = local_c * 3;
  while (local_c = local_c + -1, -1 < local_c) {
    *(undefined4 *)((long)in_RDI[1].super_Model._vptr_Model + (long)local_c * 4) = 0;
  }
  for (local_10 = 0; local_10 < in_RDI[1].super_Model.id; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffa0 =
         PointCloud::getVertexComp
                   (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                   (long)(local_10 * 3 + 1) * 4),0);
    fVar3 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3) * 4),0);
    fVar3 = in_stack_ffffffffffffffa0 - fVar3;
    in_stack_ffffffffffffffa4 =
         PointCloud::getVertexComp
                   (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                   (long)(local_10 * 3 + 1) * 4),1);
    fVar4 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3) * 4),1);
    fVar4 = in_stack_ffffffffffffffa4 - fVar4;
    fVar5 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3 + 1) * 4),2);
    fVar6 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3) * 4),2);
    fVar7 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3 + 2) * 4),0);
    fVar8 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3) * 4),0);
    fVar9 = PointCloud::getVertexComp
                      (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3 + 2) * 4),1);
    fVar10 = PointCloud::getVertexComp
                       (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                       (long)(local_10 * 3) * 4),1);
    fVar11 = PointCloud::getVertexComp
                       (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                       (long)(local_10 * 3 + 2) * 4),2);
    fVar12 = PointCloud::getVertexComp
                       (in_RDI,*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                       (long)(local_10 * 3) * 4),2);
    fVar13 = fVar4 * (fVar11 - fVar12) + -((fVar5 - fVar6) * (fVar9 - fVar10));
    fVar5 = (fVar5 - fVar6) * (fVar7 - fVar8) + -(fVar3 * (fVar11 - fVar12));
    fVar3 = fVar3 * (fVar9 - fVar10) + -(fVar4 * (fVar7 - fVar8));
    dVar14 = sqrt((double)(fVar3 * fVar3 + fVar13 * fVar13 + fVar5 * fVar5));
    fVar4 = (float)dVar14;
    if (0.0 < fVar4) {
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        pp_Var1 = in_RDI[1].super_Model._vptr_Model;
        uVar2 = (ulong)(uint)(*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                      (long)(local_10 * 3 + local_3c) * 4) * 3);
        *(float *)((long)pp_Var1 + uVar2 * 4) =
             fVar13 / fVar4 + *(float *)((long)pp_Var1 + uVar2 * 4);
        pp_Var1 = in_RDI[1].super_Model._vptr_Model;
        uVar2 = (ulong)(*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                (long)(local_10 * 3 + local_3c) * 4) * 3 + 1);
        *(float *)((long)pp_Var1 + uVar2 * 4) =
             fVar5 / fVar4 + *(float *)((long)pp_Var1 + uVar2 * 4);
        pp_Var1 = in_RDI[1].super_Model._vptr_Model;
        uVar2 = (ulong)(*(int *)((long)in_RDI[1].super_Model.origin.v[0] +
                                (long)(local_10 * 3 + local_3c) * 4) * 3 + 2);
        *(float *)((long)pp_Var1 + uVar2 * 4) =
             fVar3 / fVar4 + *(float *)((long)pp_Var1 + uVar2 * 4);
      }
    }
  }
  normalizeNormals((Mesh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void Mesh::recalculateNormals()
{
  for (int i=3*getVertexCount()-1; i>=0; i--)
  {
    normal[i]=0;
  }

  /* compute normals of triangles and sum for each vertex */

  for (int i=0; i<n; i++)
  {
    float x0=getVertexComp(triangle[3*i+1], 0)-getVertexComp(triangle[3*i], 0);
    float y0=getVertexComp(triangle[3*i+1], 1)-getVertexComp(triangle[3*i], 1);
    float z0=getVertexComp(triangle[3*i+1], 2)-getVertexComp(triangle[3*i], 2);

    float x1=getVertexComp(triangle[3*i+2], 0)-getVertexComp(triangle[3*i], 0);
    float y1=getVertexComp(triangle[3*i+2], 1)-getVertexComp(triangle[3*i], 1);
    float z1=getVertexComp(triangle[3*i+2], 2)-getVertexComp(triangle[3*i], 2);

    float nx=y0*z1-z0*y1;
    float ny=z0*x1-x0*z1;
    float nz=x0*y1-y0*x1;

    float len=sqrt(nx*nx+ny*ny+nz*nz);

    if (len > 0)
    {
      nx/=len;
      ny/=len;
      nz/=len;

      for (int k=0; k<3; k++)
      {
        normal[3*triangle[3*i+k]]+=nx;
        normal[3*triangle[3*i+k]+1]+=ny;
        normal[3*triangle[3*i+k]+2]+=nz;
      }
    }
  }

  /* normalize to length 1 */

  normalizeNormals();
}